

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelctemp.cpp
# Opt level: O1

void __thiscall
TPZIntelGen<pzshape::TPZShapeQuad>::Write
          (TPZIntelGen<pzshape::TPZShapeQuad> *this,TPZStream *buf,int withclassid)

{
  undefined4 uVar1;
  int classid;
  ulong local_60;
  TPZVec<int> local_58;
  int aiStack_38 [4];
  
  TPZInterpolatedElement::Write(&this->super_TPZInterpolatedElement,buf,withclassid);
  TPZVec<int>::TPZVec(&local_58,0);
  local_58._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018437d0;
  local_58.fNElements = 3;
  local_58.fNAlloc = 0;
  aiStack_38[0] = 0;
  aiStack_38[1] = 0;
  aiStack_38[2] = 0;
  local_58.fStore = aiStack_38;
  TPZIntQuad::GetOrder(&this->fIntRule,&local_58);
  local_60 = local_58.fNElements;
  (*buf->_vptr_TPZStream[5])(buf,&local_60,1);
  if (local_60 != 0) {
    (*buf->_vptr_TPZStream[3])(buf,local_58.fStore,local_58.fNElements & 0xffffffff);
  }
  (*buf->_vptr_TPZStream[3])
            (buf,&(this->super_TPZInterpolatedElement).super_TPZInterpolationSpace.fPreferredOrder,1
            );
  uVar1 = (**(code **)(*(long *)&(this->super_TPZInterpolatedElement).super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x20))(this);
  local_60 = CONCAT44(local_60._4_4_,uVar1);
  (*buf->_vptr_TPZStream[3])(buf,&local_60,1);
  if (local_58.fStore == aiStack_38) {
    local_58.fStore = (int *)0x0;
  }
  local_58.fNAlloc = 0;
  local_58._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_58.fStore != (int *)0x0) {
    operator_delete__(local_58.fStore);
  }
  return;
}

Assistant:

void TPZIntelGen<TSHAPE>::Write(TPZStream &buf, int withclassid) const
{
	TPZInterpolatedElement::Write(buf,withclassid);
	TPZManVector<int,3> order(3,0);
	fIntRule.GetOrder(order);
	buf.Write(order);
	buf.Write(&fPreferredOrder,1);
	int classid = this->ClassId();
	buf.Write ( &classid, 1 );
}